

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * QString::trimmed_helper(QString *str)

{
  QString *in_RDI;
  QString *unaff_retaddr;
  
  QStringAlgorithms<const_QString>::trimmed_helper(unaff_retaddr);
  return in_RDI;
}

Assistant:

QString QString::trimmed_helper(const QString &str)
{
    return QStringAlgorithms<const QString>::trimmed_helper(str);
}